

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# popups.cpp
# Opt level: O2

bool __thiscall CEditor::PopupPoint(CEditor *this,void *pContext,CUIRect View)

{
  long lVar1;
  int v_3;
  int iVar2;
  CQuad *pCVar3;
  int v;
  uint uVar4;
  long lVar5;
  int v_2;
  long lVar6;
  int *piVar7;
  long in_FS_OFFSET;
  int NewVal;
  CUIRect View_local;
  CProperty aProps [6];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  View_local = View;
  pCVar3 = GetSelectedQuad(this);
  aProps[3].m_Value = 0;
  aProps[4].m_Value = 0;
  lVar6 = 0x1a;
  aProps[0].m_Value = 0;
  aProps[1].m_Value = 0;
  aProps[2].m_Value = 0;
  for (lVar5 = 0; lVar5 != 4; lVar5 = lVar5 + 1) {
    if (((uint)this->m_SelectedPoints >> ((uint)lVar5 & 0x1f) & 1) != 0) {
      aProps[2].m_Value =
           *(int *)((long)pCVar3->m_aPoints + lVar6 * 2 + -4) << 8 |
           *(int *)((long)(pCVar3->m_aPoints + -1) + lVar6 * 2) << 0x10 |
           *(int *)((long)pCVar3->m_aPoints + lVar6 * 2 + -0xc) << 0x18 |
           *(uint *)((long)&pCVar3->m_aPoints[0].x + lVar6 * 2);
      aProps[0].m_Value = pCVar3->m_aPoints[lVar5].x >> 10;
      aProps[1].m_Value = pCVar3->m_aPoints[lVar5].y >> 10;
      aProps[3].m_Value = (int)((float)pCVar3->m_aTexcoords[lVar5].x * 0.0009765625 * 1024.0);
      aProps[4].m_Value = (int)((float)pCVar3->m_aTexcoords[lVar5].y * 0.0009765625 * 1024.0);
    }
    lVar6 = lVar6 + 8;
  }
  aProps[0].m_pName = "Pos X";
  aProps[0].m_Type = 3;
  aProps[0].m_Min = -1000000;
  aProps[0].m_Max = 1000000;
  aProps[1].m_pName = "Pos Y";
  aProps[1].m_Type = 3;
  aProps[1].m_Min = -1000000;
  aProps[1].m_Max = 1000000;
  aProps[2].m_pName = "Color";
  aProps[2].m_Type = 4;
  aProps[2].m_Min = -1;
  aProps[2].m_Max = (this->m_Map).m_lEnvelopes.num_elements;
  aProps[3].m_pName = "Tex U";
  aProps[3].m_Type = 3;
  aProps[3].m_Min = -1000000;
  aProps[3].m_Max = 1000000;
  aProps[4].m_pName = "Tex V";
  aProps[4].m_Type = 3;
  aProps[4].m_Min = -1000000;
  aProps[4].m_Max = 1000000;
  aProps[5].m_pName = (char *)0x0;
  aProps[5].m_Value = 0;
  aProps[5].m_Type = 0;
  aProps[5].m_Min = 0;
  aProps[5].m_Max = 0;
  NewVal = 0;
  iVar2 = DoProperties(this,&View_local,aProps,PopupPoint::s_aIds,&NewVal);
  if (iVar2 == -1) goto switchD_00199e6a_default;
  (this->m_Map).m_Modified = true;
  switch(iVar2) {
  case 0:
    uVar4 = this->m_SelectedPoints;
    for (lVar6 = 0; lVar6 != 4; lVar6 = lVar6 + 1) {
      if ((uVar4 >> ((uint)lVar6 & 0x1f) & 1) != 0) {
        pCVar3->m_aPoints[lVar6].x = NewVal << 10;
      }
    }
    goto switchD_00199e6a_default;
  case 1:
    uVar4 = this->m_SelectedPoints;
    for (lVar6 = 0; lVar6 != 4; lVar6 = lVar6 + 1) {
      if ((uVar4 >> ((uint)lVar6 & 0x1f) & 1) != 0) {
        pCVar3->m_aPoints[lVar6].y = NewVal << 10;
      }
    }
    if (iVar2 != 4) {
      if (iVar2 != 3) {
        if (iVar2 != 2) goto switchD_00199e6a_default;
        goto LAB_00199ea7;
      }
      goto LAB_00199f12;
    }
    break;
  case 2:
    uVar4 = this->m_SelectedPoints;
LAB_00199ea7:
    piVar7 = &pCVar3->m_aColors[0].a;
    for (lVar6 = 0; lVar6 != 4; lVar6 = lVar6 + 1) {
      if ((uVar4 >> ((uint)lVar6 & 0x1f) & 1) != 0) {
        ((CColor *)(piVar7 + -3))->r = (uint)NewVal >> 0x18;
        piVar7[-2] = (uint)NewVal >> 0x10 & 0xff;
        piVar7[-1] = (uint)NewVal >> 8 & 0xff;
        *piVar7 = NewVal & 0xff;
      }
      piVar7 = piVar7 + 4;
    }
    if (iVar2 != 4) {
      if (iVar2 != 3) goto switchD_00199e6a_default;
      goto LAB_00199f12;
    }
    break;
  case 3:
    uVar4 = this->m_SelectedPoints;
LAB_00199f12:
    for (lVar6 = 0; lVar6 != 4; lVar6 = lVar6 + 1) {
      if ((uVar4 >> ((uint)lVar6 & 0x1f) & 1) != 0) {
        pCVar3->m_aTexcoords[lVar6].x = (int)((float)NewVal * 0.0009765625 * 1024.0);
      }
    }
    if (iVar2 != 4) goto switchD_00199e6a_default;
    break;
  case 4:
    uVar4 = this->m_SelectedPoints;
    break;
  default:
    goto switchD_00199e6a_default;
  }
  for (lVar6 = 0; lVar6 != 4; lVar6 = lVar6 + 1) {
    if ((uVar4 >> ((uint)lVar6 & 0x1f) & 1) != 0) {
      pCVar3->m_aTexcoords[lVar6].y = (int)((float)NewVal * 0.0009765625 * 1024.0);
    }
  }
switchD_00199e6a_default:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return false;
}

Assistant:

bool CEditor::PopupPoint(void *pContext, CUIRect View)
{
	CEditor *pEditor = (CEditor *)pContext;
	CQuad *pQuad = pEditor->GetSelectedQuad();

	enum
	{
		PROP_POS_X=0,
		PROP_POS_Y,
		PROP_COLOR,
		PROP_TEX_U,
		PROP_TEX_V,
		NUM_PROPS,
	};

	int Color = 0;
	int x = 0, y = 0;
	int tu = 0, tv = 0;

	for(int v = 0; v < 4; v++)
	{
		if(pEditor->m_SelectedPoints&(1<<v))
		{
			Color = 0;
			Color |= pQuad->m_aColors[v].r<<24;
			Color |= pQuad->m_aColors[v].g<<16;
			Color |= pQuad->m_aColors[v].b<<8;
			Color |= pQuad->m_aColors[v].a;

			x = fx2i(pQuad->m_aPoints[v].x);
			y = fx2i(pQuad->m_aPoints[v].y);
			tu = fx2f(pQuad->m_aTexcoords[v].x)*1024;
			tv = fx2f(pQuad->m_aTexcoords[v].y)*1024;
		}
	}


	CProperty aProps[] = {
		{"Pos X", x, PROPTYPE_INT_SCROLL, -1000000, 1000000},
		{"Pos Y", y, PROPTYPE_INT_SCROLL, -1000000, 1000000},
		{"Color", Color, PROPTYPE_COLOR, -1, pEditor->m_Map.m_lEnvelopes.size()},
		{"Tex U", tu, PROPTYPE_INT_SCROLL, -1000000, 1000000},
		{"Tex V", tv, PROPTYPE_INT_SCROLL, -1000000, 1000000},
		{0},
	};

	static int s_aIds[NUM_PROPS] = {0};
	int NewVal = 0;
	int Prop = pEditor->DoProperties(&View, aProps, s_aIds, &NewVal);
	if(Prop != -1)
		pEditor->m_Map.m_Modified = true;

	if(Prop == PROP_POS_X)
	{
		for(int v = 0; v < 4; v++)
			if(pEditor->m_SelectedPoints&(1<<v))
				pQuad->m_aPoints[v].x = i2fx(NewVal);
	}
	if(Prop == PROP_POS_Y)
	{
		for(int v = 0; v < 4; v++)
			if(pEditor->m_SelectedPoints&(1<<v))
				pQuad->m_aPoints[v].y = i2fx(NewVal);
	}
	if(Prop == PROP_COLOR)
	{
		for(int v = 0; v < 4; v++)
		{
			if(pEditor->m_SelectedPoints&(1<<v))
			{
				pQuad->m_aColors[v].r = (NewVal>>24)&0xff;
				pQuad->m_aColors[v].g = (NewVal>>16)&0xff;
				pQuad->m_aColors[v].b = (NewVal>>8)&0xff;
				pQuad->m_aColors[v].a = NewVal&0xff;
			}
		}
	}
	if(Prop == PROP_TEX_U)
	{
		for(int v = 0; v < 4; v++)
			if(pEditor->m_SelectedPoints&(1<<v))
				pQuad->m_aTexcoords[v].x = f2fx(NewVal/1024.0f);
	}
	if(Prop == PROP_TEX_V)
	{
		for(int v = 0; v < 4; v++)
			if(pEditor->m_SelectedPoints&(1<<v))
				pQuad->m_aTexcoords[v].y = f2fx(NewVal/1024.0f);
	}

	return false;
}